

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.cpp
# Opt level: O0

address __thiscall
pstore::index::details::linear_node::flush(linear_node *this,transaction_base *transaction)

{
  element_type *ptr_00;
  linear_node *this_00;
  shared_ptr<void> local_70 [2];
  pair<std::shared_ptr<void>,_pstore::address> local_50;
  undefined1 local_38 [8];
  shared_ptr<void> ptr;
  size_t num_bytes;
  transaction_base *transaction_local;
  linear_node *this_local;
  address result;
  
  ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size_bytes(this);
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)local_38);
  address::address((address *)&this_local);
  transaction_base::alloc_rw
            (&local_50,transaction,
             (size_t)ptr.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,8);
  std::tie<std::shared_ptr<void>,pstore::address>(local_70,(address *)local_38);
  std::tuple<std::shared_ptr<void>&,pstore::address&>::operator=
            ((tuple<std::shared_ptr<void>&,pstore::address&> *)local_70,&local_50);
  std::pair<std::shared_ptr<void>,_pstore::address>::~pair(&local_50);
  ptr_00 = std::__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)local_38);
  this_00 = (linear_node *)operator_new(0x18,ptr_00);
  if (this_00 != (linear_node *)0x0) {
    linear_node(this_00,this);
  }
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_38);
  return (address)(value_type)this_local;
}

Assistant:

address linear_node::flush (transaction_base & transaction) const {
                std::size_t const num_bytes = this->size_bytes ();

                std::shared_ptr<void> ptr;
                address result;
                std::tie (ptr, result) = transaction.alloc_rw (num_bytes, alignof (linear_node));
                new (ptr.get ()) linear_node (*this);
                return result;
            }